

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::EndFunctionBody(BinaryReaderIR *this,Index index)

{
  Result RVar1;
  
  RVar1 = PopLabel(this);
  if (RVar1.enum_ != Error) {
    this->current_func_ = (Func *)0x0;
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderIR::EndFunctionBody(Index index) {
  CHECK_RESULT(PopLabel());
  current_func_ = nullptr;
  return Result::Ok;
}